

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int msocket_connect_inet6(msocket_t *self,char *address,uint16_t port)

{
  int iVar1;
  int iVar2;
  int sockfd;
  int result;
  sockaddr_in6 saddr6;
  uint16_t port_local;
  char *address_local;
  msocket_t *self_local;
  
  saddr6.sin6_addr.__in6_u.__u6_addr16[7] = port;
  unique0x10000111 = address;
  memset(&sockfd,0,0x1c);
  iVar1 = inet_pton(10,stack0xffffffffffffffe0,&saddr6);
  if (iVar1 < 1) {
    self_local._4_4_ = -1;
  }
  else {
    (self->tcpInfo).port = saddr6.sin6_addr.__in6_u.__u6_addr16[7];
    strcpy((self->tcpInfo).addr,stack0xffffffffffffffe0);
    sockfd._0_2_ = 10;
    sockfd._2_2_ = htons((self->tcpInfo).port);
    iVar1 = socket(10,1,6);
    if (iVar1 < 0) {
      self_local._4_4_ = -1;
    }
    else {
      iVar2 = connect(iVar1,(sockaddr *)&sockfd,0x1c);
      if (iVar2 < 0) {
        close(iVar1);
        self_local._4_4_ = -1;
      }
      else {
        (self->tcpInfo).port = saddr6.sin6_addr.__in6_u.__u6_addr16[7];
        self->tcpsockfd = iVar1;
        self_local._4_4_ = 0;
      }
    }
  }
  return self_local._4_4_;
}

Assistant:

static int msocket_connect_inet6(msocket_t* self, const char* address, uint16_t port)
{
   struct sockaddr_in6 saddr6;
   int result;
   SOCKET_T sockfd;

   memset(&saddr6, 0, sizeof(saddr6));
   result = inet_pton(AF_INET6, address, &(saddr6.sin6_addr));
   if (result <= 0) {
      //inet_pton retuns 1 on success, -1 on unsupported address family and 0 when string wasn't successfully parsed.
      return -1;
   }

   self->tcpInfo.port = port;
#ifdef _WIN32
   strcpy_s(self->tcpInfo.addr, MSOCKET_ADDRSTRLEN, address);
#else
   strcpy(self->tcpInfo.addr, address);
#endif
   saddr6.sin6_family = AF_INET6;
   saddr6.sin6_port = htons((uint16_t)self->tcpInfo.port);
   sockfd = socket(PF_INET6, SOCK_STREAM, IPPROTO_TCP);

   if (IS_INVALID_SOCKET(sockfd)) {
      return -1;
   }
   result = connect(sockfd, (struct sockaddr*)&saddr6, sizeof(saddr6));
   if (result < 0) {
      SOCKET_CLOSE(sockfd);
      return -1;
   }
   self->tcpInfo.port = port;
   self->tcpsockfd = sockfd;
   return 0;
}